

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::ShaderAtomicOpCase
          (ShaderAtomicOpCase *this,Context *context,char *name,char *funcName,
          AtomicOperandType operandType,DataType type,Precision precision,UVec3 *workGroupSize)

{
  long lVar1;
  allocator<char> local_29;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,funcName);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicOpCase_0219e520;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_funcName,funcName,&local_29)
  ;
  this->m_operandType = operandType;
  this->m_type = type;
  this->m_precision = precision;
  lVar1 = 0;
  do {
    (this->m_workGroupSize).m_data[lVar1] = workGroupSize->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (this->m_numWorkGroups).m_data[0] = 4;
  (this->m_numWorkGroups).m_data[1] = 4;
  *(undefined8 *)((this->m_numWorkGroups).m_data + 2) = 4;
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

ShaderAtomicOpCase::ShaderAtomicOpCase (Context& context, const char* name, const char* funcName, AtomicOperandType operandType, DataType type, Precision precision, const UVec3& workGroupSize)
	: TestCase			(context, name, funcName)
	, m_funcName		(funcName)
	, m_operandType		(operandType)
	, m_type			(type)
	, m_precision		(precision)
	, m_workGroupSize	(workGroupSize)
	, m_numWorkGroups	(4,4,4)
	, m_initialValue	(0)
	, m_program			(DE_NULL)
{
}